

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

optional<bool> __thiscall
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_impl_helpers *this,
          olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *inode,byte key_byte,basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *db_instance,read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  long *plVar2;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar3;
  long lVar4;
  uintptr_t uVar5;
  olc_impl_helpers oVar6;
  undefined8 uVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  __int_type_conflict _Var11;
  __int_type_conflict _Var12;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar13;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar14;
  write_guard wVar15;
  bool bVar16;
  ushort uVar17;
  int iVar18;
  ulong uVar19;
  pthread_t pVar20;
  ulong uVar21;
  undefined7 in_register_00000011;
  ushort uVar22;
  ulong __n;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar23;
  optimistic_lock *poVar24;
  write_guard local_70;
  write_guard child_guard_1;
  __atomic_base<unsigned_long> local_60;
  write_guard node_guard;
  write_guard local_48;
  write_guard node_guard_1;
  __atomic_base<unsigned_long> local_38;
  write_guard child_guard;
  
  uVar21 = k.field_0._0_8_;
  oVar6 = this[((ulong)inode & 0xffffffff) + 0x21];
  if (oVar6 == (olc_impl_helpers)0xff) {
    plVar8 = (long *)(db_instance->root_pointer_lock).version.version.
                     super___atomic_base<unsigned_long>._M_i;
    lVar9 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
    if (plVar8[1] < 1) goto LAB_001dd133;
    lVar10 = *plVar8;
    if (lVar9 != lVar10) {
      LOCK();
      plVar2 = plVar8 + 1;
      lVar4 = *plVar2;
      *plVar2 = *plVar2 + -1;
      UNLOCK();
      if (SBORROW8(lVar4,1) != *plVar2 < 0) goto LAB_001dd114;
      if (lVar9 != lVar10) {
        (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0
        ;
        goto LAB_001dcf18;
      }
    }
    LOCK();
    plVar8 = plVar8 + 1;
    lVar4 = *plVar8;
    *plVar8 = *plVar8 + -1;
    UNLOCK();
    if (SBORROW8(lVar4,1) != *plVar8 < 0) goto LAB_001dd114;
    (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0;
    if (lVar9 != lVar10) goto LAB_001dcf18;
    poVar24 = parent_critical_section->lock;
    _Var11 = (parent_critical_section->version).version;
    if ((poVar24->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001dd133;
    _Var12 = (poVar24->version).version.super___atomic_base<unsigned_long>._M_i;
    if (_Var11 == _Var12) {
LAB_001dccf0:
      LOCK();
      paVar1 = &poVar24->read_lock_count;
      lVar9 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar9,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_001dd114:
        __assert_fail("old_value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
      }
    }
    else {
      LOCK();
      paVar1 = &poVar24->read_lock_count;
      lVar9 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar9,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_001dd114;
      if (_Var11 == _Var12) goto LAB_001dccf0;
    }
    bVar16 = _Var11 == _Var12;
    parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_001dcef0:
    uVar22 = (ushort)bVar16;
    uVar17 = 0;
  }
  else {
    *(undefined8 *)child_type = *(undefined8 *)(this + (ulong)(byte)oVar6 * 8 + 0x140);
    node_guard_1.lock = &db_instance->root_pointer_lock;
    bVar16 = optimistic_lock::check
                       (parent_critical_section->lock,
                        (version_type)(parent_critical_section->version).version);
    if (bVar16) {
      child_guard_1.lock = k.field_0._8_8_;
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffffa0);
      *child_in_parent =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           local_60._M_i;
      local_60._M_i = 0;
      child_in_parent[1] =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffffa0);
      if (*child_in_parent !=
          (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0
         ) {
        uVar7 = *(undefined8 *)child_type;
        *(byte *)&child_critical_section->lock = (byte)uVar7 & 7;
        if ((uVar7 & (I256|I48)) != LEAF) {
          (node_in_parent->value)._M_i.tagged_ptr =
               (uintptr_t)(this + (ulong)(byte)oVar6 * 8 + 0x140);
          plVar8 = (long *)((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>
                           ._M_i;
          lVar9 = ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
          if (plVar8[1] < 1) goto LAB_001dd133;
          lVar10 = *plVar8;
          if (lVar9 == lVar10) {
LAB_001dcc74:
            LOCK();
            plVar8 = plVar8 + 1;
            lVar4 = *plVar8;
            *plVar8 = *plVar8 + -1;
            UNLOCK();
            if (SBORROW8(lVar4,1) != *plVar8 < 0) goto LAB_001dd114;
          }
          else {
            LOCK();
            plVar2 = plVar8 + 1;
            lVar4 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar4,1) != *plVar2 < 0) goto LAB_001dd114;
            if (lVar9 == lVar10) goto LAB_001dcc74;
          }
          uVar22 = (ushort)(lVar9 == lVar10);
          ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
LAB_001dce2d:
          uVar17 = 1;
          goto LAB_001dcef2;
        }
        uVar19 = (ulong)*(uint *)((uVar7 & 0xfffffffffffffff8) + 0x18);
        __n = uVar21;
        if (uVar19 < uVar21) {
          __n = uVar19;
        }
        iVar18 = bcmp((void *)CONCAT71(in_register_00000011,key_byte),
                      (void *)((uVar7 & 0xfffffffffffffff8) + 0x20),__n);
        wVar15 = node_guard_1;
        if (iVar18 != 0 || uVar19 != uVar21) {
          plVar8 = (long *)((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>
                           ._M_i;
          lVar9 = ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
          if (plVar8[1] < 1) goto LAB_001dd133;
          lVar10 = *plVar8;
          if (lVar9 != lVar10) {
            LOCK();
            plVar2 = plVar8 + 1;
            lVar4 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar4,1) != *plVar2 < 0) goto LAB_001dd114;
            if (lVar9 != lVar10) {
LAB_001dd0d7:
              ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              goto LAB_001dcf18;
            }
          }
          LOCK();
          plVar8 = plVar8 + 1;
          lVar4 = *plVar8;
          *plVar8 = *plVar8 + -1;
          UNLOCK();
          if (SBORROW8(lVar4,1) != *plVar8 < 0) goto LAB_001dd114;
          ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
          if (lVar9 != lVar10) goto LAB_001dcf18;
          poVar24 = parent_critical_section->lock;
          _Var11 = (parent_critical_section->version).version;
          if ((poVar24->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001dd133;
          _Var12 = (poVar24->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var11 != _Var12) {
            LOCK();
            paVar1 = &poVar24->read_lock_count;
            lVar9 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar9,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_001dd114;
            if (_Var11 != _Var12) {
              parent_critical_section->lock = (optimistic_lock *)0x0;
              goto LAB_001dcf18;
            }
          }
          LOCK();
          paVar1 = &poVar24->read_lock_count;
          lVar9 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar9,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_001dd114;
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (_Var11 != _Var12) goto LAB_001dcf18;
          piVar23 = *child_in_parent;
          piVar13 = child_in_parent[1];
          if ((long)piVar23[1].value._M_i.tagged_ptr < 1) {
LAB_001dd133:
            __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
          }
          piVar14 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)(piVar23->value)._M_i.tagged_ptr;
          if (piVar13 == piVar14) {
LAB_001dced4:
            LOCK();
            piVar23 = piVar23 + 1;
            uVar5 = (piVar23->value)._M_i.tagged_ptr;
            (piVar23->value)._M_i.tagged_ptr = (piVar23->value)._M_i.tagged_ptr - 1;
            UNLOCK();
            if (SBORROW8(uVar5,1) != (long)(piVar23->value)._M_i.tagged_ptr < 0) goto LAB_001dd114;
          }
          else {
            LOCK();
            piVar3 = piVar23 + 1;
            uVar5 = (piVar3->value)._M_i.tagged_ptr;
            (piVar3->value)._M_i.tagged_ptr = (piVar3->value)._M_i.tagged_ptr - 1;
            UNLOCK();
            if (SBORROW8(uVar5,1) != (long)(piVar3->value)._M_i.tagged_ptr < 0) goto LAB_001dd114;
            if (piVar13 == piVar14) goto LAB_001dced4;
          }
          bVar16 = piVar13 == piVar14;
          *child_in_parent =
               (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                *)0x0;
          goto LAB_001dcef0;
        }
        if (this[0x20] == (olc_impl_helpers)0x11) {
          basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
          ::
          make_db_inode_unique_ptr<unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&>
                    ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                      *)&stack0xffffffffffffffa0,(db_type *)child_guard_1.lock,
                     (olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)this);
          bVar16 = optimistic_lock::try_upgrade_to_write_lock
                             ((optimistic_lock *)
                              ((wVar15.lock)->version).version.super___atomic_base<unsigned_long>.
                              _M_i,(version_type)
                                   ((wVar15.lock)->read_lock_count).super___atomic_base<long>._M_i);
          local_38._M_i = 0;
          if (bVar16) {
            local_38._M_i = ((wVar15.lock)->version).version.super___atomic_base<unsigned_long>._M_i
            ;
          }
          ((wVar15.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
          if (local_38._M_i != 0) {
            bVar16 = optimistic_lock::try_upgrade_to_write_lock
                               (parent_critical_section->lock,
                                (version_type)(parent_critical_section->version).version);
            local_48.lock = (optimistic_lock *)0x0;
            if (bVar16) {
              local_48.lock = parent_critical_section->lock;
            }
            parent_critical_section->lock = (optimistic_lock *)0x0;
            if (local_48.lock != (optimistic_lock *)0x0) {
              bVar16 = optimistic_lock::try_upgrade_to_write_lock
                                 ((optimistic_lock *)*child_in_parent,
                                  (version_type)child_in_parent[1]);
              poVar24 = (optimistic_lock *)0x0;
              if (bVar16) {
                poVar24 = (optimistic_lock *)*child_in_parent;
              }
              *child_in_parent =
                   (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    *)0x0;
              local_70.lock = poVar24;
              if (poVar24 != (optimistic_lock *)0x0) {
                olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::init((olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                        *)node_guard.lock,(EVP_PKEY_CTX *)child_guard_1.lock);
                wVar15 = node_guard;
                node_guard.lock = (optimistic_lock *)0x0;
                if (((ulong)wVar15.lock & 7) != 0) {
                  __assert_fail("(result & ptr_bit_mask) == uintptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                                ,0x182,
                                "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                               );
                }
                node_critical_section->lock = wVar15.lock | 2;
                if (local_48.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!node_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x644,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_48<std::span<const std::byte>, std::span<const std::byte>>]"
                               );
                }
                if (local_70.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!child_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x645,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_48<std::span<const std::byte>, std::span<const std::byte>>]"
                               );
                }
                (node_in_parent->value)._M_i.tagged_ptr = 0;
                optimistic_lock::write_guard::~write_guard(&local_70);
                optimistic_lock::write_guard::~write_guard(&local_48);
                optimistic_lock::write_guard::~write_guard((write_guard *)&local_38);
                std::
                unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)&stack0xffffffffffffffa0);
                if (poVar24 != (optimistic_lock *)0x0) {
                  LOCK();
                  child_guard_1.lock[0x1b].read_lock_count.super___atomic_base<long>._M_i =
                       child_guard_1.lock[0x1b].read_lock_count.super___atomic_base<long>._M_i + 1;
                  UNLOCK();
                  uVar17 = 1;
                  uVar22 = 1;
                  goto LAB_001dcef2;
                }
                goto LAB_001dcf18;
              }
              optimistic_lock::write_guard::~write_guard(&local_70);
            }
            optimistic_lock::write_guard::~write_guard(&local_48);
          }
          optimistic_lock::write_guard::~write_guard((write_guard *)&local_38);
          std::
          unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)&stack0xffffffffffffffa0);
        }
        else {
          plVar8 = (long *)((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>
                           ._M_i;
          lVar9 = ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
          if (plVar8[1] < 1) goto LAB_001dd133;
          lVar10 = *plVar8;
          if (lVar9 != lVar10) {
            LOCK();
            plVar2 = plVar8 + 1;
            lVar4 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar4,1) != *plVar2 < 0) goto LAB_001dd114;
            if (lVar9 != lVar10) goto LAB_001dd0d7;
          }
          LOCK();
          plVar8 = plVar8 + 1;
          lVar4 = *plVar8;
          *plVar8 = *plVar8 + -1;
          UNLOCK();
          if (SBORROW8(lVar4,1) != *plVar8 < 0) goto LAB_001dd114;
          ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
          if (lVar9 == lVar10) {
            bVar16 = optimistic_lock::try_upgrade_to_write_lock
                               (parent_critical_section->lock,
                                (version_type)(parent_critical_section->version).version);
            uVar22 = 0;
            local_60._M_i = 0;
            if (bVar16) {
              local_60._M_i = (__int_type_conflict)parent_critical_section->lock;
            }
            parent_critical_section->lock = (optimistic_lock *)0x0;
            if ((optimistic_lock *)local_60._M_i != (optimistic_lock *)0x0) {
              bVar16 = optimistic_lock::try_upgrade_to_write_lock
                                 ((optimistic_lock *)*child_in_parent,
                                  (version_type)child_in_parent[1]);
              piVar23 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                         *)0x0;
              if (bVar16) {
                piVar23 = *child_in_parent;
              }
              *child_in_parent =
                   (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    *)0x0;
              local_38._M_i = (__int_type_conflict)piVar23;
              if (piVar23 !=
                  (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                   *)0x0) {
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                          ((atomic_version_type *)piVar23);
                pVar20 = pthread_self();
                ((__atomic_base<unsigned_long> *)&piVar23[2].value._M_i)->_M_i = pVar20;
                local_38._M_i = 0;
                olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::remove((olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                          *)this,(char *)((ulong)inode & 0xff));
                (node_in_parent->value)._M_i.tagged_ptr = 0;
              }
              uVar22 = (ushort)(piVar23 !=
                               (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                                *)0x0);
              optimistic_lock::write_guard::~write_guard((write_guard *)&local_38);
            }
            optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffa0);
            goto LAB_001dce2d;
          }
        }
      }
    }
    else {
      parent_critical_section->lock = (optimistic_lock *)0x0;
    }
LAB_001dcf18:
    uVar17 = 0;
    uVar22 = 0;
  }
LAB_001dcef2:
  return (_Optional_base<bool,_true,_true>)(uVar17 | uVar22 << 8);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}